

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O1

void google::protobuf::Join<int_const*>(int *start,int *end,char *delim,string *result)

{
  int32 *piVar1;
  char *buffer;
  char *pcVar2;
  long lVar3;
  AlphaNum local_60;
  
  if (start != end) {
    buffer = local_60.digits;
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        std::__cxx11::string::append((char *)result);
      }
      piVar1 = (int32 *)((long)start + lVar3);
      local_60.piece_data_ = buffer;
      pcVar2 = FastInt32ToBufferLeft(*piVar1,buffer);
      local_60.piece_size_ = (long)pcVar2 - (long)buffer;
      StrAppend(result,&local_60);
      lVar3 = lVar3 + 4;
    } while (piVar1 + 1 != end);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end,
          const char* delim, string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}